

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O2

void setpause(global_State *g)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  long lVar3;
  
  uVar2 = g->GCestimate / 100;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  lVar3 = uVar2 * (long)g->gcpause;
  if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / auVar1,0) <= (long)g->gcpause) {
    lVar3 = 0x7fffffffffffffff;
  }
  luaE_setdebt(g,(g->GCdebt + g->totalbytes) - lVar3);
  return;
}

Assistant:

static void setpause(global_State *g) {
    l_mem threshold, debt;
    l_mem estimate = g->GCestimate / PAUSEADJ;  /* adjust 'estimate' */
    lua_assert(estimate > 0);
    threshold = (g->gcpause < MAX_LMEM / estimate)  /* overflow? */
                ? estimate * g->gcpause  /* no overflow */
                : MAX_LMEM;  /* overflow; truncate to maximum */
    debt = gettotalbytes(g) - threshold;
    luaE_setdebt(g, debt);
}